

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundEvenCaseInstance::compare
          (RoundEvenCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 aBits;
  uint uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  bool bVar9;
  uint uVar10;
  ostringstream *poVar11;
  int iVar12;
  float fVar13;
  ulong uVar14;
  deUint32 bBits;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar10 - 1 < 2) {
    if ((int)uVar5 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar14 = 0;
    do {
      fVar13 = *(float *)((long)pvVar3 + uVar14 * 4);
      fVar16 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar15 = floorf(fVar13);
      fVar15 = fVar13 - fVar15;
      iVar6 = (int)(fVar13 - fVar15);
      if (fVar15 <= 0.5) {
        iVar6 = iVar6 + (uint)((byte)iVar6 & fVar15 == 0.5);
      }
      else {
        iVar6 = iVar6 + 1;
      }
      fVar15 = (float)iVar6;
      if (uVar10 == 2) {
LAB_0085fea5:
        fVar13 = (float)((int)fVar15 - (int)fVar16);
        if ((uint)fVar15 < (uint)fVar16) {
          fVar13 = (float)-((int)fVar15 - (int)fVar16);
        }
      }
      else if ((fVar16 != 0.0) || (NAN(fVar16))) {
        if (iVar6 != 0) goto LAB_0085fea5;
        fVar13 = ABS(fVar16);
      }
      else {
        fVar13 = ABS(fVar15);
      }
      if (fVar13 != 0.0) {
        poVar11 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        local_34.value = fVar15;
        poVar8 = anon_unknown_0::operator<<(poVar8,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_008601ac:
        local_40.value = (deUint64)(uint)fVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar8);
        return false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  else {
    uVar10 = -1 << (0x17 - (&DAT_00b8730c)[(ulong)uVar10 * 4] & 0x1f);
    if ((int)uVar5 < 1) {
      return true;
    }
    fVar16 = (float)(uVar10 & 0x7fffff ^ 0x3fffffff) + -1.0;
    fVar13 = (float)~uVar10;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar14 = 0;
    do {
      fVar15 = *(float *)((long)pvVar3 + uVar14 * 4);
      fVar1 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar17 = fVar15 - fVar16;
      fVar18 = floorf(fVar17);
      fVar18 = fVar17 - fVar18;
      iVar6 = (int)(fVar17 - fVar18);
      if (fVar18 <= 0.5) {
        iVar6 = iVar6 + (uint)((byte)iVar6 & fVar18 == 0.5);
      }
      else {
        iVar6 = iVar6 + 1;
      }
      fVar15 = fVar15 + fVar16;
      fVar17 = floorf(fVar15);
      fVar17 = fVar15 - fVar17;
      iVar7 = (int)(fVar15 - fVar17);
      if (fVar17 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar17 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      iVar6 = (int)(float)iVar6;
      iVar7 = (int)(float)iVar7;
      if (iVar7 < iVar6) {
LAB_008600a9:
        poVar11 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = [",5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] with ULP threshold ",0x15);
        goto LAB_008601ac;
      }
      bVar9 = false;
      iVar12 = iVar6;
      do {
        fVar15 = (float)iVar12;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar17 = ABS(fVar1);
          if (iVar12 != 0) {
            fVar17 = (float)((int)fVar15 - (int)fVar1);
            if ((uint)fVar15 < (uint)fVar1) {
              fVar17 = (float)-((int)fVar15 - (int)fVar1);
            }
          }
        }
        else {
          fVar17 = ABS(fVar15);
        }
        if ((uint)fVar17 <= (uint)fVar13) {
          bVar9 = true;
          break;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 <= iVar7);
      if (!bVar9) goto LAB_008600a9;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar5);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}